

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HVectorBase.cpp
# Opt level: O1

void __thiscall HVectorBase<double>::tight(HVectorBase<double> *this)

{
  int iVar1;
  pointer piVar2;
  pointer pdVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  
  if (this->count < 0) {
    pdVar3 = (this->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = (long)(this->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pdVar3;
    if (lVar4 != 0) {
      lVar4 = lVar4 >> 3;
      lVar6 = 0;
      do {
        if (ABS(pdVar3[lVar6]) < 1e-14) {
          pdVar3[lVar6] = 0.0;
        }
        lVar6 = lVar6 + 1;
      } while (lVar4 + (ulong)(lVar4 == 0) != lVar6);
    }
    return;
  }
  if (this->count < 1) {
    iVar5 = 0;
  }
  else {
    piVar2 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = 0;
    iVar5 = 0;
    do {
      iVar1 = piVar2[lVar4];
      if (1e-14 <= ABS(pdVar3[iVar1])) {
        lVar6 = (long)iVar5;
        iVar5 = iVar5 + 1;
        piVar2[lVar6] = iVar1;
      }
      else {
        pdVar3[iVar1] = 0.0;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < this->count);
  }
  this->count = iVar5;
  return;
}

Assistant:

void HVectorBase<Real>::tight() {
  /*
   * Zero values in Vector.array that do not exceed kHighsTiny in
   * magnitude, maintaining index if it is well defined
   */
  HighsInt totalCount = 0;
  using std::abs;
  if (count < 0) {
    for (size_t my_index = 0; my_index < array.size(); my_index++)
      if (abs(array[my_index]) < kHighsTiny) array[my_index] = 0;
  } else {
    for (HighsInt i = 0; i < count; i++) {
      const HighsInt my_index = index[i];
      const Real& value = array[my_index];
      if (abs(value) >= kHighsTiny) {
        index[totalCount++] = my_index;
      } else {
        array[my_index] = Real{0};
      }
    }
    count = totalCount;
  }
}